

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int graph_5_4::prim_2(m_graph g)

{
  code *pcVar1;
  undefined4 *puVar2;
  undefined4 auStack_58 [2];
  undefined1 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  int local_38;
  int local_34;
  int i_2;
  int i_1;
  int i;
  int k;
  int j;
  int min;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  
  __vla_expr0 = (unsigned_long)auStack_58;
  local_50 = &stack0x00000008;
  __vla_expr1 = (unsigned_long)(uint)g.vexs[8];
  local_48 = (undefined4 *)((long)auStack_58 - (__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0));
  _j = (ulong)(uint)g.vexs[8];
  puVar2 = (undefined4 *)((long)local_48 - (_j * 4 + 0xf & 0xfffffffffffffff0));
  local_40 = puVar2;
  *local_48 = 0;
  *puVar2 = 0;
  for (i_2 = 1; i_2 < *(int *)(local_50 + 0x1b8); i_2 = i_2 + 1) {
    local_48[i_2] = 0;
    local_40[i_2] = *(undefined4 *)(local_50 + (long)i_2 * 4);
  }
  for (local_34 = 1; local_34 < *(int *)(local_50 + 0x1b8); local_34 = local_34 + 1) {
    k = -1;
    i = 1;
    i_1 = 0;
    while (i < *(int *)(local_50 + 0x1b8)) {
      if ((local_40[i] != 0) && ((int)local_40[i] < k)) {
        k = local_40[i];
        i_1 = i;
      }
      i = i + 1;
      local_40[i_1] = 0;
      for (local_38 = 1; local_38 < *(int *)(local_50 + 0x1b8); local_38 = local_38 + 1) {
        if ((local_40[local_38] != 0) &&
           (*(int *)(local_50 + (long)local_38 * 4 + (long)i_1 * 0x28) < (int)local_40[local_38])) {
          local_40[local_38] = *(undefined4 *)(local_50 + (long)local_38 * 4 + (long)i_1 * 0x28);
          local_48[local_38] = i_1;
        }
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int prim_2(m_graph g) {
        int adjvex[g.vnum], dis[g.vnum], min, j, k;
        adjvex[0] = 0;
        dis[0] = 0;
        for (int i = 1; i < g.vnum; i++) {
            adjvex[i] = 0;
            dis[i] = g.arc[0][i];
        }
        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[j] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                j++;
                //do sth to adjvex[k]
                dis[k] = 0;
                for (int i = 1; i < g.vnum; i++) {
                    if (dis[i] != 0 && g.arc[k][i] < dis[i]) {
                        dis[i] = g.arc[k][i];
                        adjvex[i] = k;
                    }
                }
            }
        }
    }